

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aeron.cpp
# Opt level: O0

ptr_t __thiscall aeron::Aeron::mapCncFile(Aeron *this,Context *context)

{
  int32_t iVar1;
  int64_t iVar2;
  longlong lVar3;
  DriverTimeoutException *pDVar4;
  char *pcVar5;
  IllegalStateException *this_00;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr_t pVar6;
  longlong timeMs;
  ManyToOneRingBuffer ringBuffer;
  AtomicBuffer toDriverBuffer;
  int32_t cncVersion;
  longlong startMs;
  ptr_t *cncBuffer;
  AtomicBuffer *in_stack_fffffffffffffb38;
  ManyToOneRingBuffer *in_stack_fffffffffffffb40;
  allocator *paVar7;
  char *in_stack_fffffffffffffb48;
  char *in_stack_fffffffffffffb50;
  ptr_t *in_stack_fffffffffffffb70;
  Context *in_stack_fffffffffffffb78;
  ptr_t *in_stack_fffffffffffffb98;
  char *in_stack_fffffffffffffbc8;
  int local_3ac;
  undefined1 local_3a8 [24];
  string local_390;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  ptr_t *local_320;
  undefined1 local_312;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  ManyToOneRingBuffer local_2a0;
  AtomicBuffer local_268;
  undefined1 local_24a;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1ba;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  int local_11c;
  string local_118 [54];
  undefined1 local_e2;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48 [39];
  undefined1 local_21;
  longlong local_20;
  long local_18;
  
  local_18 = in_RDX;
  local_20 = currentTimeMillis();
  local_21 = 0;
  std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
            ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e8e94);
  do {
    while( true ) {
      Context::cncFileName_abi_cxx11_(in_stack_fffffffffffffb78);
      std::__cxx11::string::c_str();
      iVar2 = util::MemoryMappedFile::getFileSize(in_stack_fffffffffffffbc8);
      std::__cxx11::string::~string(local_48);
      if (0 < iVar2) break;
      lVar3 = currentTimeMillis();
      if (local_20 + *(long *)(local_18 + 0x120) < lVar3) {
        local_e2 = 1;
        pDVar4 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(in_stack_fffffffffffffb78);
        std::operator+(&local_78,"CnC file not created: ",&local_98);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b8,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,&local_b9);
        pcVar5 = util::past_prefix(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,pcVar5,&local_e1);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar4,&local_78,&local_b8,&local_e0,0x69);
        local_e2 = 0;
        __cxa_throw(pDVar4,&util::DriverTimeoutException::typeinfo,
                    util::DriverTimeoutException::~DriverTimeoutException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb70);
    }
    Context::cncFileName_abi_cxx11_(in_stack_fffffffffffffb78);
    std::__cxx11::string::c_str();
    util::MemoryMappedFile::mapExisting((char *)in_stack_fffffffffffffb38);
    std::shared_ptr<aeron::util::MemoryMappedFile>::operator=
              ((shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb40,
               (shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb38);
    std::shared_ptr<aeron::util::MemoryMappedFile>::~shared_ptr
              ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e91ea);
    std::__cxx11::string::~string(local_118);
    local_11c = 0;
    while( true ) {
      std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
                ((shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb40,
                 (shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb38);
      iVar1 = CncFileDescriptor::cncVersionVolatile(in_stack_fffffffffffffb70);
      local_11c = iVar1;
      std::shared_ptr<aeron::util::MemoryMappedFile>::~shared_ptr
                ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e9250);
      if (iVar1 != 0) break;
      lVar3 = currentTimeMillis();
      if (local_20 + *(long *)(local_18 + 0x120) < lVar3) {
        local_1ba = 1;
        pDVar4 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(in_stack_fffffffffffffb78);
        std::operator+(&local_150,"CnC file is created but not initialised: ",&local_170);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_190,
                   "MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",&local_191);
        pcVar5 = util::past_prefix(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1b8,pcVar5,&local_1b9);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar4,&local_150,&local_190,&local_1b8,0x78);
        local_1ba = 0;
        __cxa_throw(pDVar4,&util::DriverTimeoutException::typeinfo,
                    util::DriverTimeoutException::~DriverTimeoutException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb70);
    }
    if (local_11c != 0xf) {
      local_24a = 1;
      this_00 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_200,local_11c);
      std::operator+(&local_1e0,"CnC file version not supported: ",&local_200);
      paVar7 = &local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_220,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 paVar7);
      pcVar5 = util::past_prefix(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_248,pcVar5,&local_249);
      util::IllegalStateException::IllegalStateException
                (this_00,&local_1e0,&local_220,&local_248,0x81);
      local_24a = 0;
      __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
                  util::IllegalStateException::~IllegalStateException);
    }
    std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
              ((shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb40,
               (shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb38);
    CncFileDescriptor::createToDriverBuffer(in_stack_fffffffffffffb98);
    std::shared_ptr<aeron::util::MemoryMappedFile>::~shared_ptr
              ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e977b);
    concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer
              (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    while (iVar2 = concurrent::ringbuffer::ManyToOneRingBuffer::consumerHeartbeatTime(&local_2a0),
          iVar2 == 0) {
      lVar3 = currentTimeMillis();
      if (local_20 + *(long *)(local_18 + 0x120) < lVar3) {
        local_312 = 1;
        pDVar4 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        paVar7 = &local_2c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2c0,"no driver heartbeat detected",paVar7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2e8,
                   "MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",&local_2e9);
        pcVar5 = util::past_prefix(in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
        paVar7 = &local_311;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_310,pcVar5,paVar7);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar4,&local_2c0,&local_2e8,&local_310,0x8b);
        local_312 = 0;
        __cxa_throw(pDVar4,&util::DriverTimeoutException::typeinfo,
                    util::DriverTimeoutException::~DriverTimeoutException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb70);
    }
    in_stack_fffffffffffffb70 = (ptr_t *)currentTimeMillis();
    local_320 = in_stack_fffffffffffffb70;
    iVar2 = concurrent::ringbuffer::ManyToOneRingBuffer::consumerHeartbeatTime(&local_2a0);
    if (iVar2 < (long)local_320 - *(long *)(local_18 + 0x120)) {
      if (local_20 + *(long *)(local_18 + 0x120) < (long)local_320) {
        local_3a8[0x16] = 1;
        pDVar4 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"no driver heartbeat detected",&local_341)
        ;
        paVar7 = &local_369;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_368,
                   "MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",paVar7);
        pcVar5 = util::past_prefix((char *)paVar7,in_stack_fffffffffffffb48);
        paVar7 = (allocator *)(local_3a8 + 0x17);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_390,pcVar5,paVar7);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar4,&local_340,&local_368,&local_390,0x96);
        local_3a8[0x16] = 0;
        __cxa_throw(pDVar4,&util::DriverTimeoutException::typeinfo,
                    util::DriverTimeoutException::~DriverTimeoutException);
      }
      in_stack_fffffffffffffb38 = (AtomicBuffer *)local_3a8;
      std::shared_ptr<aeron::util::MemoryMappedFile>::shared_ptr
                ((shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb38);
      std::shared_ptr<aeron::util::MemoryMappedFile>::operator=
                ((shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb40,
                 (shared_ptr<aeron::util::MemoryMappedFile> *)in_stack_fffffffffffffb38);
      std::shared_ptr<aeron::util::MemoryMappedFile>::~shared_ptr
                ((shared_ptr<aeron::util::MemoryMappedFile> *)0x1e9c9b);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffb70);
      local_3ac = 2;
    }
    else {
      local_3ac = 3;
    }
    concurrent::AtomicBuffer::~AtomicBuffer(&local_268);
  } while (local_3ac == 2);
  pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (ptr_t)pVar6.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline MemoryMappedFile::ptr_t Aeron::mapCncFile(Context &context)
{
    const long long startMs = currentTimeMillis();
    MemoryMappedFile::ptr_t cncBuffer;

    while (true)
    {
        while (MemoryMappedFile::getFileSize(context.cncFileName().c_str()) <= 0)
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException("CnC file not created: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_16);
        }

        cncBuffer = MemoryMappedFile::mapExisting(context.cncFileName().c_str());

        std::int32_t cncVersion = 0;

        while (0 == (cncVersion = CncFileDescriptor::cncVersionVolatile(cncBuffer)))
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(
                    "CnC file is created but not initialised: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        if (CncFileDescriptor::CNC_VERSION != cncVersion)
        {
            throw util::IllegalStateException(
                "CnC file version not supported: " + std::to_string(cncVersion), SOURCEINFO);
        }

        AtomicBuffer toDriverBuffer(CncFileDescriptor::createToDriverBuffer(cncBuffer));
        ManyToOneRingBuffer ringBuffer(toDriverBuffer);

        while (0 == ringBuffer.consumerHeartbeatTime())
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        const long long timeMs = currentTimeMillis();
        if (ringBuffer.consumerHeartbeatTime() < (timeMs - context.m_mediaDriverTimeout))
        {
            if (timeMs > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            cncBuffer = nullptr;

            std::this_thread::sleep_for(IDLE_SLEEP_MS_100);
            continue;
        }

        break;
    }

    return cncBuffer;
}